

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

LogicalExpr __thiscall
mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_VarCounter>::
ReadLogicalExpr(NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_VarCounter>
                *this,int opcode)

{
  Kind KVar1;
  char *pcVar2;
  int iVar3;
  OpCodeInfo *pOVar4;
  BinaryReader<mp::internal::EndiannessConverter> *this_00;
  PairwiseArgHandler args;
  
  pOVar4 = GetOpCodeInfo(opcode);
  KVar1 = pOVar4->first_kind;
  switch(KVar1) {
  case ATLEAST:
    ReadNumericExpr(this,false);
    this_00 = this->reader_;
    pcVar2 = (this_00->super_BinaryReaderBase).super_ReaderBase.ptr_;
    (this_00->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar2;
    (this_00->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar2 + 1;
    if (*pcVar2 == 'o') {
      iVar3 = ReadOpCode(this);
      pOVar4 = GetOpCodeInfo(iVar3);
      if (pOVar4->kind != COUNT) {
        this_00 = this->reader_;
        goto LAB_001aa103;
      }
    }
    else {
LAB_001aa103:
      BinaryReaderBase::ReportError<>(&this_00->super_BinaryReaderBase,(CStringRef)0x213782);
    }
    ReadCountExpr(this);
    break;
  case IMPLICATION:
    ReadLogicalExpr(this);
    ReadLogicalExpr(this);
LAB_001aa14c:
    ReadLogicalExpr(this);
    break;
  case EXISTS:
    iVar3 = ReadNumArgs(this,3);
    NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,VarCounter>::
    DoReadArgs<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,VarCounter>::LogicalExprReader,mp::NLHandler<mp::NullNLHandler<int>,int>::ArgHandler>
              ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,VarCounter> *
               )this,iVar3,&args);
    break;
  case ALLDIFF:
    iVar3 = ReadNumArgs(this,1);
    NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,VarCounter>::
    DoReadArgs<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,VarCounter>::NumericExprReader,mp::NLHandler<mp::NullNLHandler<int>,int>::ArgHandler>
              ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,VarCounter> *
               )this,iVar3,&args);
    break;
  default:
    if (KVar1 == FIRST_RELATIONAL) {
      BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_VarCounter>::NumericExprReader>
      ::BinaryArgReader((BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_VarCounter>::NumericExprReader>
                         *)&args,this);
      return 0;
    }
    if (KVar1 == FIRST_BINARY_LOGICAL) {
      BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_VarCounter>::LogicalExprReader>
      ::BinaryArgReader((BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_VarCounter>::LogicalExprReader>
                         *)&args,this);
      return 0;
    }
    if (KVar1 == NOT) goto LAB_001aa14c;
  case ATMOST:
  case EXACTLY:
  case NOT_ATLEAST:
  case NOT_ATMOST:
  case LAST_LOGICAL_COUNT:
  case FORALL:
    BinaryReaderBase::ReportError<>(&this->reader_->super_BinaryReaderBase,(CStringRef)0x2151e2);
  }
  return 0;
}

Assistant:

typename Handler::LogicalExpr
    NLReader<Reader, Handler>::ReadLogicalExpr(int opcode) {
  const internal::OpCodeInfo &info = internal::GetOpCodeInfo(opcode);
  expr::Kind kind = info.kind;
  switch (info.first_kind) {
  case expr::NOT:
    return handler_.OnNot(ReadLogicalExpr());
  case expr::FIRST_BINARY_LOGICAL: {
    BinaryArgReader<LogicalExprReader> args(*this);
    return handler_.OnBinaryLogical(kind, args.lhs, args.rhs);
  }
  case expr::FIRST_RELATIONAL: {
    BinaryArgReader<> args(*this);
    return handler_.OnRelational(kind, args.lhs, args.rhs);
  }
  case expr::FIRST_LOGICAL_COUNT: {
    NumericExpr lhs = ReadNumericExpr();
    char c = reader_.ReadChar();
    if (c != 'o' || internal::GetOpCodeInfo(ReadOpCode()).kind != expr::COUNT)
      reader_.ReportError("expected count expression");
    return handler_.OnLogicalCount(kind, lhs, ReadCountExpr());
  }
  case expr::IMPLICATION: {
    // Read an implication (=>).
    LogicalExpr condition = ReadLogicalExpr();
    LogicalExpr then_expr = ReadLogicalExpr();
    LogicalExpr else_expr = ReadLogicalExpr();
    return handler_.OnImplication(condition, then_expr, else_expr);
  }
  case expr::FIRST_ITERATED_LOGICAL: {
    // Read an iterated logical expression (exists or forall).
    int num_args = ReadNumArgs();
    typename Handler::LogicalArgHandler args =
        handler_.BeginIteratedLogical(kind, num_args);
    ReadArgs<LogicalExprReader>(num_args, args);
    return handler_.EndIteratedLogical(args);
  }
  case expr::FIRST_PAIRWISE: {
    // Read a pairwise expression (alldiff or !alldiff).
    int num_args = ReadNumArgs(1);
    typename Handler::PairwiseArgHandler args =
        handler_.BeginPairwise(kind, num_args);
    ReadArgs<NumericExprReader>(num_args, args);
    return handler_.EndPairwise(args);
  }
  default:
    reader_.ReportError("expected logical expression opcode");
  }
  return LogicalExpr();
}